

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_lfdpx(DisasContext_conflict10 *ctx)

{
  _Bool _Var1;
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  uint uVar2;
  TCGTemp *pTVar3;
  TCGv_i64 arg;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret;
  
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x30
                     );
    ctx->access_type = 0x30;
  }
  pTVar3 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx_00);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar2 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(tcg_ctx_01,INDEX_op_mov_i64,(TCGArg)((long)tcg_ctx_01 + (long)ret),
                          (TCGArg)(arg + (long)tcg_ctx_01));
      }
      goto LAB_00b9c053;
    }
  }
  else {
    tcg_gen_op3_ppc64(tcg_ctx_01,INDEX_op_add_i64,(TCGArg)((long)tcg_ctx_01 + (long)ret),
                      (TCGArg)((long)&tcg_ctx_01->pool_cur + (long)cpu_gpr[uVar2]),
                      (TCGArg)(arg + (long)tcg_ctx_01));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00b9c053;
  }
  tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,arg);
LAB_00b9c053:
  pTVar3 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  _Var1 = ctx->le_mode;
  tcg_gen_qemu_ld_i64_ppc64
            (ctx->uc->tcg_ctx,(TCGv_i64)((long)pTVar3 - (long)tcg_ctx_00),ret,(long)ctx->mem_idx,
             ctx->default_tcg_memop_mask | MO_64);
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)pTVar3,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)((uint)_Var1 * 0x10 + 0x12b28 + (ctx->opcode >> 0x11 & 0x1f0)));
  tcg_gen_addi_i64_ppc64(tcg_ctx_00,ret,ret,8);
  tcg_gen_qemu_ld_i64_ppc64
            (ctx->uc->tcg_ctx,(TCGv_i64)((long)pTVar3 - (long)tcg_ctx_00),ret,(long)ctx->mem_idx,
             ctx->default_tcg_memop_mask | MO_64);
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)pTVar3,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)((ctx->opcode >> 0x11 & 0x1f0) + 0x12b28 + (uint)(_Var1 ^ 1) * 0x10));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,pTVar3);
  return;
}

Assistant:

static void gen_lfdpx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    t0 = tcg_temp_new_i64(tcg_ctx);
    /*
     * We only need to swap high and low halves. gen_qemu_ld64_i64
     * does necessary 64-bit byteswap already.
     */
    if (unlikely(ctx->le_mode)) {
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode) + 1, t0);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    } else {
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode), t0);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode) + 1, t0);
    }
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}